

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *
vkt::pipeline::getLevelsVector<tcu::Texture2D>
          (vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
           *__return_storage_ptr__,Texture2D *texture)

{
  int iVar1;
  ConstPixelBufferAccess *__src;
  reference __dest;
  int local_30;
  int levelNdx;
  allocator<tcu::PixelBufferAccess> local_1a;
  undefined1 local_19;
  Texture2D *local_18;
  Texture2D *texture_local;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *levels;
  
  local_19 = 0;
  local_18 = texture;
  texture_local = (Texture2D *)__return_storage_ptr__;
  iVar1 = tcu::TextureLevelPyramid::getNumLevels(&texture->super_TextureLevelPyramid);
  std::allocator<tcu::PixelBufferAccess>::allocator(&local_1a);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::vector
            (__return_storage_ptr__,(long)iVar1,&local_1a);
  std::allocator<tcu::PixelBufferAccess>::~allocator(&local_1a);
  for (local_30 = 0;
      iVar1 = tcu::TextureLevelPyramid::getNumLevels(&local_18->super_TextureLevelPyramid),
      local_30 < iVar1; local_30 = local_30 + 1) {
    __src = tcu::TextureLevelPyramid::getLevel(&local_18->super_TextureLevelPyramid,local_30);
    __dest = std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::
             operator[](__return_storage_ptr__,(long)local_30);
    memcpy(__dest,__src,0x28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::PixelBufferAccess> getLevelsVector (const TcuTextureType& texture)
{
	std::vector<tcu::PixelBufferAccess> levels(texture.getNumLevels());

	for (int levelNdx = 0; levelNdx < texture.getNumLevels(); levelNdx++)
		levels[levelNdx] = *reinterpret_cast<const tcu::PixelBufferAccess*>(&texture.getLevel(levelNdx));

	return levels;
}